

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymdeltat.c
# Opt level: O0

UINT8 YM_DELTAT_ADPCM_Read(YM_DELTAT *DELTAT)

{
  UINT8 local_19;
  UINT8 v;
  YM_DELTAT *DELTAT_local;
  
  local_19 = '\0';
  if ((DELTAT->portstate & 0xe0) == 0x20) {
    if (DELTAT->memread != '\0') {
      DELTAT->now_addr = DELTAT->start << 1;
      DELTAT->memread = DELTAT->memread + 0xff;
      return '\0';
    }
    if (DELTAT->now_addr == DELTAT->end * 2) {
      if ((DELTAT->status_set_handler != (STATUS_CHANGE_HANDLER)0x0) &&
         (DELTAT->status_change_EOS_bit != '\0')) {
        (*DELTAT->status_set_handler)
                  (DELTAT->status_change_which_chip,DELTAT->status_change_EOS_bit);
      }
    }
    else {
      local_19 = DELTAT->memory[DELTAT->now_addr >> 1 & DELTAT->memory_mask];
      DELTAT->now_addr = DELTAT->now_addr + 2;
      if ((DELTAT->status_reset_handler != (STATUS_CHANGE_HANDLER)0x0) &&
         (DELTAT->status_change_BRDY_bit != '\0')) {
        (*DELTAT->status_reset_handler)
                  (DELTAT->status_change_which_chip,DELTAT->status_change_BRDY_bit);
      }
      if ((DELTAT->status_set_handler != (STATUS_CHANGE_HANDLER)0x0) &&
         (DELTAT->status_change_BRDY_bit != '\0')) {
        (*DELTAT->status_set_handler)
                  (DELTAT->status_change_which_chip,DELTAT->status_change_BRDY_bit);
      }
    }
  }
  return local_19;
}

Assistant:

UINT8 YM_DELTAT_ADPCM_Read(YM_DELTAT *DELTAT)
{
	UINT8 v = 0;

	/* external memory read */
	if ( (DELTAT->portstate & 0xe0)==0x20 )
	{
		/* two dummy reads */
		if (DELTAT->memread)
		{
			DELTAT->now_addr = DELTAT->start << 1;
			DELTAT->memread--;
			return 0;
		}


		if ( DELTAT->now_addr != (DELTAT->end<<1) )
		{
			v = DELTAT->memory[(DELTAT->now_addr>>1)&DELTAT->memory_mask];

			/*emu_logf(DELTAT->logger, DEVLOG_TRACE, "YM Delta-T memory read  $%08x, v=$%02x\n", DELTAT->now_addr >> 1, v);*/

			DELTAT->now_addr+=2; /* two nibbles at a time */

			/* reset BRDY bit in status register, which means we are reading the memory now */
			if (DELTAT->status_reset_handler && DELTAT->status_change_BRDY_bit)
				(DELTAT->status_reset_handler)(DELTAT->status_change_which_chip, DELTAT->status_change_BRDY_bit);

			/* setup a timer that will callback us in 10 master clock cycles for Y8950
			* in the callback set the BRDY flag to 1 , which means we have another data ready.
			* For now, we don't really do this; we simply reset and set the flag in zero time, so that the IRQ will work.
			*/
			/* set BRDY bit in status register */
			if (DELTAT->status_set_handler != NULL && DELTAT->status_change_BRDY_bit)
				(DELTAT->status_set_handler)(DELTAT->status_change_which_chip, DELTAT->status_change_BRDY_bit);
		}
		else
		{
			/* set EOS bit in status register */
			if (DELTAT->status_set_handler != NULL && DELTAT->status_change_EOS_bit)
				(DELTAT->status_set_handler)(DELTAT->status_change_which_chip, DELTAT->status_change_EOS_bit);
		}
	}

	return v;
}